

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O1

void bench_ecmult_multi_teardown(void *arg,int iters)

{
  undefined8 *puVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  secp256k1_fe *in_RCX;
  long extraout_RDX;
  int iVar6;
  secp256k1_gej *a;
  secp256k1_ge *psVar7;
  secp256k1_gej *psVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  secp256k1_gej tmp;
  secp256k1_gej sStack_a8;
  
  bVar12 = 0;
  uVar11 = (uint)((ulong)(long)iters / *(ulong *)((long)arg + 0x40));
  if (0 < (int)uVar11) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      a = (secp256k1_gej *)(*(long *)((long)arg + 0x60) + lVar9);
      psVar8 = &sStack_a8;
      secp256k1_gej_add_var
                (&sStack_a8,a,(secp256k1_gej *)(*(long *)((long)arg + 0x30) + lVar9),in_RCX);
      if (sStack_a8.infinity == 0) {
        bench_ecmult_multi_teardown_cold_1();
        uVar2 = in_RCX->n[2];
        lVar9 = (ulong)((int)in_RCX[1].n[4] != 0) + extraout_RDX;
        if (lVar9 == 0) {
          lVar9 = in_RCX[2].n[0] * 0x20;
          puVar1 = (undefined8 *)(uVar2 + lVar9);
          uVar3 = *puVar1;
          uVar4 = puVar1[1];
          puVar1 = (undefined8 *)(uVar2 + 0x10 + lVar9);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)psVar8 + 0x10) = *puVar1;
          *(undefined8 *)((long)psVar8 + 0x18) = uVar5;
          *(undefined8 *)psVar8 = uVar3;
          *(undefined8 *)((long)psVar8 + 8) = uVar4;
          psVar7 = &secp256k1_ge_const_g;
        }
        else {
          iVar6 = (int)lVar9;
          uVar10 = (ulong)(((int)in_RCX[2].n[0] + iVar6 & 0x7fffU) << 5);
          puVar1 = (undefined8 *)(uVar2 + uVar10);
          uVar3 = *puVar1;
          uVar4 = puVar1[1];
          puVar1 = (undefined8 *)(uVar2 + 0x10 + uVar10);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)psVar8 + 0x10) = *puVar1;
          *(undefined8 *)((long)psVar8 + 0x18) = uVar5;
          *(undefined8 *)psVar8 = uVar3;
          *(undefined8 *)((long)psVar8 + 8) = uVar4;
          psVar7 = (secp256k1_ge *)
                   ((ulong)((iVar6 + (int)in_RCX[2].n[1]) - 1U & 0x7fff) * 0x58 + in_RCX->n[3]);
        }
        for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
          (a->x).n[0] = (psVar7->x).n[0];
          psVar7 = (secp256k1_ge *)((long)psVar7 + ((ulong)bVar12 * -2 + 1) * 8);
          a = (secp256k1_gej *)((long)a + (ulong)bVar12 * -0x10 + 8);
        }
        return;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x80;
    } while (uVar10 < (uVar11 & 0x7fffffff));
  }
  return;
}

Assistant:

static void bench_ecmult_multi_teardown(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int iter;
    iters = iters / data->count;
    /* Verify the results in teardown, to avoid doing comparisons while benchmarking. */
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_gej tmp;
        secp256k1_gej_add_var(&tmp, &data->output[iter], &data->expected_output[iter], NULL);
        CHECK(secp256k1_gej_is_infinity(&tmp));
    }
}